

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O3

void pybind11::detail::
     vector_if_equal_operator<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>
               (enable_if_t<is_comparable<vector<long>_>::value,_pybind11::class_<std::vector<long>,_std::unique_ptr<std::vector<long>_>_>_>
                *cl)

{
  is_operator local_31;
  arg local_30;
  
  local_30.name =
       (char *)op_impl<(pybind11::detail::op_id)25,_(pybind11::detail::op_type)0,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
               ::execute;
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::
  allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>::def<bool(*)(std::
  vector<long,std::allocator<long>>const&,std::vector<long,std::allocator<long>>const&),pybind11::
  operator>((allocator<long>>const___pybind11 *)cl,"__eq__",
            (_func_bool_vector<long,_std::allocator<long>_>_ptr_vector<long,_std::allocator<long>_>_ptr
             **)&local_30,&local_31);
  local_30.name =
       (char *)op_impl<(pybind11::detail::op_id)26,_(pybind11::detail::op_type)0,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<long,_std::allocator<long>_>_>
               ::execute;
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::
  allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>::def<bool(*)(std::
  vector<long,std::allocator<long>>const&,std::vector<long,std::allocator<long>>const&),pybind11::
  operator>((allocator<long>>const___pybind11 *)cl,"__ne__",
            (_func_bool_vector<long,_std::allocator<long>_>_ptr_vector<long,_std::allocator<long>_>_ptr
             **)&local_30,&local_31);
  local_30.name = "x";
  local_30._8_1_ = 2;
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>(std::enable_if<is_comparable<std::vector<long,std::allocator<long>>>::value,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>::type&)::_lambda(std::vector<long,std::allocator<long>>const&,long_const&)_1_,pybind11::arg,char[53]>
            ((class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
              *)cl,"count",(type *)&local_31,&local_30,
             (char (*) [53])"Return the number of times ``x`` appears in the list");
  local_30.name = "x";
  local_30._8_1_ = 2;
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>(std::enable_if<is_comparable<std::vector<long,std::allocator<long>>>::value,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>::type&)::_lambda(std::vector<long,std::allocator<long>>&,long_const&)_1_,pybind11::arg,char[95]>
            ((class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
              *)cl,"remove",(type *)&local_31,&local_30,
             (char (*) [95])
             "Remove the first item from the list whose value is x. It is an error if there is no such item."
            );
  local_30.name = "x";
  local_30._8_1_ = 2;
  class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
  ::
  def<pybind11::detail::vector_if_equal_operator<std::vector<long,std::allocator<long>>,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>(std::enable_if<is_comparable<std::vector<long,std::allocator<long>>>::value,pybind11::class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>>::type&)::_lambda(std::vector<long,std::allocator<long>>const&,long_const&)_2_,pybind11::arg,char[41]>
            ((class_<std::vector<long,std::allocator<long>>,std::unique_ptr<std::vector<long,std::allocator<long>>,std::default_delete<std::vector<long,std::allocator<long>>>>>
              *)cl,"__contains__",(type *)&local_31,&local_30,
             (char (*) [41])"Return true the container contains ``x``");
  return;
}

Assistant:

void vector_if_equal_operator(enable_if_t<is_comparable<Vector>::value, Class_> &cl) {
    using T = typename Vector::value_type;

    cl.def(self == self);
    cl.def(self != self);

    cl.def("count",
        [](const Vector &v, const T &x) {
            return std::count(v.begin(), v.end(), x);
        },
        arg("x"),
        "Return the number of times ``x`` appears in the list"
    );

    cl.def("remove", [](Vector &v, const T &x) {
            auto p = std::find(v.begin(), v.end(), x);
            if (p != v.end())
                v.erase(p);
            else
                throw value_error();
        },
        arg("x"),
        "Remove the first item from the list whose value is x. "
        "It is an error if there is no such item."
    );

    cl.def("__contains__",
        [](const Vector &v, const T &x) {
            return std::find(v.begin(), v.end(), x) != v.end();
        },
        arg("x"),
        "Return true the container contains ``x``"
    );
}